

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O2

nvlist_t * nvlist_get_array_next(nvlist_t *nvl)

{
  nvlist_t *pnVar1;
  char *__assertion;
  
  if (nvl == (nvlist_t *)0x0) {
    __assertion = "(nvl) != ((void*)0)";
  }
  else {
    if (nvl->nvl_magic == 0x6e766c) {
      if (nvl->nvl_array_next != (nvpair_t *)0x0) {
        pnVar1 = nvpair_get_nvlist(nvl->nvl_array_next);
        return pnVar1;
      }
      return (nvlist_t *)0x0;
    }
    __assertion = "(nvl)->nvl_magic == 0x6e766c";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                ,0x100,"const nvlist_t *nvlist_get_array_next(const nvlist_t *)");
}

Assistant:

const nvlist_t *
nvlist_get_array_next(const nvlist_t *nvl)
{
	nvpair_t *nvp;

	NVLIST_ASSERT(nvl);

	nvp = nvl->nvl_array_next;
	if (nvp == NULL)
		return (NULL);

	return (nvpair_get_nvlist(nvp));
}